

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall Assimp::FIBase64ValueImpl::toString_abi_cxx11_(FIBase64ValueImpl *this)

{
  byte *pbVar1;
  ostream *poVar2;
  string local_1d0 [48];
  size_type local_1a0;
  size_type i;
  size_type valueSize;
  int imod3;
  uint8_t c2;
  uint8_t c1;
  ostringstream os;
  FIBase64ValueImpl *this_local;
  
  if ((this->strValueValid & 1U) == 0) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&imod3);
    valueSize._7_1_ = 0;
    valueSize._0_4_ = 0;
    i = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  (&(this->super_FIBase64Value).super_FIByteValue.value);
    for (local_1a0 = 0; local_1a0 < i; local_1a0 = local_1a0 + 1) {
      pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(this->super_FIBase64Value).super_FIByteValue.value,local_1a0);
      valueSize._6_1_ = *pbVar1;
      if ((int)valueSize == 0) {
        std::operator<<((ostream *)&imod3,
                        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [valueSize._6_1_ >> 2]);
        valueSize._0_4_ = 1;
      }
      else if ((int)valueSize == 1) {
        std::operator<<((ostream *)&imod3,
                        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(valueSize._7_1_ & 3) << 4 | (uint)(valueSize._6_1_ >> 4)]);
        valueSize._0_4_ = 2;
      }
      else if ((int)valueSize == 2) {
        poVar2 = std::operator<<((ostream *)&imod3,
                                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                                 [(uint)(valueSize._6_1_ >> 6) + (valueSize._7_1_ & 0xf) * 4]);
        std::operator<<(poVar2,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [valueSize._6_1_ & 0x3f]);
        valueSize._0_4_ = 0;
      }
      valueSize._7_1_ = valueSize._6_1_;
    }
    if ((int)valueSize == 1) {
      poVar2 = std::operator<<((ostream *)&imod3,
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [(valueSize._7_1_ & 3) << 4]);
      std::operator<<(poVar2,"==");
    }
    else if ((int)valueSize == 2) {
      poVar2 = std::operator<<((ostream *)&imod3,
                               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                               [(ulong)(valueSize._7_1_ & 0xf) * 4]);
      std::operator<<(poVar2,'=');
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->strValue,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imod3);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            uint8_t c1 = 0, c2;
            int imod3 = 0;
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                c2 = value[i];
                switch (imod3) {
                case 0:
                    os << basis_64[c2 >> 2];
                    imod3 = 1;
                    break;
                case 1:
                    os << basis_64[((c1 & 0x03) << 4) | ((c2 & 0xf0) >> 4)];
                    imod3 = 2;
                    break;
                case 2:
                    os << basis_64[((c1 & 0x0f) << 2) | ((c2 & 0xc0) >> 6)] << basis_64[c2 & 0x3f];
                    imod3 = 0;
                    break;
                }
                c1 = c2;
            }
            switch (imod3) {
            case 1:
                os << basis_64[(c1 & 0x03) << 4] << "==";
                break;
            case 2:
                os << basis_64[(c1 & 0x0f) << 2] << '=';
                break;
            }
            strValue = os.str();
        }
        return strValue;
    }